

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmSetPropertyCommand::HandleCacheEntry(cmSetPropertyCommand *this,string *cacheKey)

{
  char *pcVar1;
  char *pcVar2;
  cmState *this_00;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  pcVar1 = (this->PropertyName)._M_dataplus._M_p;
  pcVar2 = (this->PropertyValue)._M_dataplus._M_p;
  this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  if (this->Remove == true) {
    std::__cxx11::string::string((string *)&local_68,pcVar1,(allocator *)&local_48);
    cmState::RemoveCacheEntryProperty(this_00,cacheKey,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->AppendMode == true) {
    std::__cxx11::string::string((string *)&local_68,pcVar1,&local_69);
    std::__cxx11::string::string((string *)&local_48,pcVar2,&local_6a);
    cmState::AppendCacheEntryProperty(this_00,cacheKey,&local_68,&local_48,this->AppendAsString);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,pcVar1,&local_69);
    std::__cxx11::string::string((string *)&local_48,pcVar2,&local_6a);
    cmState::SetCacheEntryProperty(this_00,cacheKey,&local_68,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheEntry(std::string const& cacheKey)
{
  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char* value = this->PropertyValue.c_str();
  cmState* state = this->Makefile->GetState();
  if (this->Remove)
    {
    state->RemoveCacheEntryProperty(cacheKey, name);
    }
  if(this->AppendMode)
    {
    state->AppendCacheEntryProperty(cacheKey, name, value,
                                     this->AppendAsString);
    }
  else
    {
    state->SetCacheEntryProperty(cacheKey, name, value);
    }

  return true;
}